

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O2

void __thiscall Prog::add_stream_path(Prog *this,char *filename)

{
  ALLEGRO_PATH *pAVar1;
  char *__s;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pAVar1 = make_path(filename);
  __s = (char *)al_path_cstr(pAVar1,0x2f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->stream_paths,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  al_destroy_path(pAVar1);
  return;
}

Assistant:

void Prog::add_stream_path(char const *filename)
{
   ALLEGRO_PATH *path = make_path(filename);
   stream_paths.push_back(al_path_cstr(path, '/'));
   al_destroy_path(path);
}